

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

ggml_tensor * __thiscall
llm_graph_context::build_norm
          (llm_graph_context *this,ggml_tensor *cur,ggml_tensor *mw,ggml_tensor *mb,
          llm_norm_type type,int il)

{
  undefined8 uVar1;
  long lVar2;
  ggml_tensor *pgVar3;
  
  if (type == LLM_NORM_GROUP) {
    uVar1 = ggml_reshape_3d(this->ctx0,cur,cur->ne[0],1,cur->ne[1]);
    lVar2 = ggml_group_norm(this->hparams->f_norm_group_eps,this->ctx0,uVar1,
                            this->hparams->n_norm_groups);
    cur = (ggml_tensor *)
          ggml_reshape_2d(this->ctx0,lVar2,*(undefined8 *)(lVar2 + 0x10),
                          *(undefined8 *)(lVar2 + 0x20));
  }
  else if (type == LLM_NORM_RMS) {
    cur = (ggml_tensor *)ggml_rms_norm(this->hparams->f_norm_rms_eps,this->ctx0,cur);
  }
  else if (type == LLM_NORM) {
    cur = (ggml_tensor *)ggml_norm(this->hparams->f_norm_eps,this->ctx0,cur);
  }
  if (mw != (ggml_tensor *)0x0 || mb != (ggml_tensor *)0x0) {
    cb(this,cur,"norm",il);
    if (mw == (ggml_tensor *)0x0) {
      if (mb != (ggml_tensor *)0x0) goto LAB_001ebe93;
    }
    else {
      cur = (ggml_tensor *)ggml_mul(this->ctx0,cur,mw);
      if (mb != (ggml_tensor *)0x0) {
        cb(this,cur,"norm_w",il);
LAB_001ebe93:
        pgVar3 = (ggml_tensor *)ggml_add(this->ctx0,cur,mb);
        return pgVar3;
      }
    }
  }
  return cur;
}

Assistant:

ggml_tensor * llm_graph_context::build_norm(
         ggml_tensor * cur,
         ggml_tensor * mw,
         ggml_tensor * mb,
       llm_norm_type   type,
                 int   il) const {
    switch (type) {
        case LLM_NORM:       cur = ggml_norm    (ctx0, cur, hparams.f_norm_eps);     break;
        case LLM_NORM_RMS:   cur = ggml_rms_norm(ctx0, cur, hparams.f_norm_rms_eps); break;
        case LLM_NORM_GROUP:
            {
                cur = ggml_reshape_3d(ctx0, cur, cur->ne[0], 1, cur->ne[1]);
                cur = ggml_group_norm(ctx0, cur, hparams.n_norm_groups, hparams.f_norm_group_eps);
                cur = ggml_reshape_2d(ctx0, cur, cur->ne[0],    cur->ne[2]);
            } break;
    }

    if (mw || mb) {
        cb(cur, "norm", il);
    }

    if (mw) {
        cur = ggml_mul(ctx0, cur, mw);
        if (mb) {
            cb(cur, "norm_w", il);
        }
    }

    if (mb) {
        cur = ggml_add(ctx0, cur, mb);
    }

    return cur;
}